

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::TestRecursion(int size,char *pattern)

{
  size_t sVar1;
  ulong uVar2;
  undefined4 in_register_0000003c;
  string domain;
  StringPiece local_110;
  Options local_100;
  RE2 re;
  
  domain._M_dataplus._M_p = (pointer)&domain.field_2;
  domain._M_string_length = 0;
  domain.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&domain);
  sVar1 = strlen((char *)CONCAT44(in_register_0000003c,size));
  for (uVar2 = 0; uVar2 != 0x3c00; uVar2 = uVar2 + 1) {
    domain._M_dataplus._M_p[uVar2] = ((char *)CONCAT44(in_register_0000003c,size))[uVar2 % sVar1];
  }
  local_110.ptr_ = "([a-zA-Z0-9]|-)+(\\.([a-zA-Z0-9]|-)+)*(\\.)?";
  local_110.length_ = 0x2a;
  RE2::Options::Options(&local_100,Quiet);
  RE2::RE2(&re,&local_110,&local_100);
  local_100._0_8_ = domain._M_dataplus._M_p;
  local_100.max_mem_._0_4_ = (undefined4)domain._M_string_length;
  RE2::FullMatch<>((StringPiece *)&local_100,&re);
  RE2::~RE2(&re);
  std::__cxx11::string::~string((string *)&domain);
  return;
}

Assistant:

static void TestRecursion(int size, const char* pattern) {
  // Fill up a string repeating the pattern given
  string domain;
  domain.resize(size);
  size_t patlen = strlen(pattern);
  for (int i = 0; i < size; i++) {
    domain[i] = pattern[i % patlen];
  }
  // Just make sure it doesn't crash due to too much recursion.
  RE2 re("([a-zA-Z0-9]|-)+(\\.([a-zA-Z0-9]|-)+)*(\\.)?", RE2::Quiet);
  RE2::FullMatch(domain, re);
}